

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdIsTrue<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,(unsigned_char)8>(Thread *this)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Simd<unsigned_short,_(unsigned_char)__b_> SVar7;
  Simd<unsigned_short,_(unsigned_char)__b_> val;
  unsigned_short local_18 [8];
  
  SVar7 = Pop<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this);
  local_18[0] = SVar7.v[0];
  local_18[1] = SVar7.v[1];
  local_18[2] = SVar7.v[2];
  local_18[3] = SVar7.v[3];
  local_18[4] = SVar7.v[4];
  local_18[5] = SVar7.v[5];
  local_18[6] = SVar7.v[6];
  local_18[7] = SVar7.v[7];
  lVar2 = 0;
  lVar3 = 0;
  lVar4 = 0;
  do {
    uVar1 = *(undefined4 *)(local_18 + lVar2);
    auVar5._4_4_ = uVar1;
    auVar5._0_4_ = uVar1;
    auVar5._8_4_ = uVar1;
    auVar5._12_4_ = uVar1;
    auVar5 = pshufhw(auVar5,auVar5,0x55);
    auVar6._0_2_ = -(ushort)(auVar5._0_2_ == 0);
    auVar6._2_2_ = -(ushort)(auVar5._2_2_ == 0);
    auVar6._4_2_ = -(ushort)(auVar5._4_2_ == 0);
    auVar6._6_2_ = -(ushort)(auVar5._6_2_ == 0);
    auVar6._8_2_ = -(ushort)(auVar5._8_2_ == 0);
    auVar6._10_2_ = -(ushort)(auVar5._10_2_ == 0);
    auVar6._12_2_ = -(ushort)(auVar5._12_2_ == 0);
    auVar6._14_2_ = -(ushort)(auVar5._14_2_ == 0);
    lVar3 = lVar3 + SUB168(~auVar6 & _DAT_001d8750,0);
    lVar4 = lVar4 + SUB168(~auVar6 & _DAT_001d8750,8);
    lVar2 = lVar2 + 2;
  } while (lVar2 != 8);
  Push<bool>(this,7 < (ulong)(lVar4 + lVar3));
  return Ok;
}

Assistant:

RunResult Thread::DoSimdIsTrue() {
  using L = typename S::LaneType;
  auto val = Pop<S>();
  Push(std::count_if(std::begin(val.v), std::end(val.v),
                     [](L x) { return x != 0; }) >= count);
  return RunResult::Ok;
}